

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# group.c
# Opt level: O2

void prepare_keyvalue(char *keyvalue)

{
  uint uVar1;
  size_t sVar2;
  ulong uVar3;
  ulong uVar4;
  
  sVar2 = strlen(keyvalue);
  if ((*keyvalue == '\'') && (keyvalue[(int)sVar2 + -1] == '\'')) {
    uVar1 = (int)sVar2 - 2;
    uVar3 = 0;
    uVar4 = 0;
    if (0 < (int)uVar1) {
      uVar4 = (ulong)uVar1;
    }
    for (; uVar4 != uVar3; uVar3 = uVar3 + 1) {
      keyvalue[uVar3] = keyvalue[uVar3 + 1];
    }
    keyvalue[(int)uVar1] = '\0';
  }
  sVar2 = strlen(keyvalue);
  uVar1 = (int)sVar2 - 1;
  uVar4 = 0;
  uVar3 = 0;
  if (0 < (int)uVar1) {
    uVar3 = (ulong)uVar1;
  }
  do {
    if (uVar3 == uVar4) {
LAB_0016a188:
      if ((uint)uVar3 != uVar1) {
        for (; (-1 < (int)uVar1 && (keyvalue[uVar1] == ' ')); uVar1 = uVar1 - 1) {
          keyvalue[uVar1] = '\0';
        }
      }
      return;
    }
    if (keyvalue[uVar4] != ' ') {
      uVar3 = uVar4 & 0xffffffff;
      goto LAB_0016a188;
    }
    uVar4 = uVar4 + 1;
  } while( true );
}

Assistant:

void prepare_keyvalue(char *keyvalue) /* string containing keyword value     */

/*
  strip off all single quote characters "'" and blank spaces from a keyword
  value retrieved via fits_read_key*() routines

  this is necessary so that a standard comparision of keyword values may
  be made
*/

{

  int i;
  int length;

  /*
    strip off any leading or trailing single quotes (`) and (') from
    the keyword value
  */

  length = strlen(keyvalue) - 1;

  if(keyvalue[0] == '\'' && keyvalue[length] == '\'')
    {
      for(i = 0; i < length - 1; ++i) keyvalue[i] = keyvalue[i+1];
      keyvalue[length-1] = 0;
    }
  
  /*
    strip off any trailing blanks from the keyword value; note that if the
    keyvalue consists of nothing but blanks then no blanks are stripped
  */

  length = strlen(keyvalue) - 1;

  for(i = 0; i < length && keyvalue[i] == ' '; ++i);

  if(i != length)
    {
      for(i = length; i >= 0 && keyvalue[i] == ' '; --i) keyvalue[i] = '\0';
    }
}